

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

antecedentConsequentVectorsStruct * allocAntecedentConsequentVectorsStruct(void)

{
  antecedentConsequentVectorsStruct *paVar1;
  antecedentConsequentVectorsStruct *newStructure;
  
  paVar1 = (antecedentConsequentVectorsStruct *)malloc(0x10);
  paVar1->attrAntecedents = (Vec_Int_t *)0x0;
  paVar1->attrConsequentCandidates = (Vec_Int_t *)0x0;
  if (paVar1 != (antecedentConsequentVectorsStruct *)0x0) {
    return paVar1;
  }
  __assert_fail("newStructure != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                ,0x3a,
                "struct antecedentConsequentVectorsStruct *allocAntecedentConsequentVectorsStruct()"
               );
}

Assistant:

struct antecedentConsequentVectorsStruct *allocAntecedentConsequentVectorsStruct()
{
	struct antecedentConsequentVectorsStruct *newStructure;

	newStructure = (struct antecedentConsequentVectorsStruct *)malloc(sizeof (struct antecedentConsequentVectorsStruct));

	newStructure->attrAntecedents = NULL;
	newStructure->attrConsequentCandidates = NULL;
		
	assert( newStructure != NULL );
	return newStructure;
}